

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatFileUnpacker.cpp
# Opt level: O2

bool __thiscall DatUnpacker::DatFileUnpacker::unpack(DatFileUnpacker *this,Arguments *arguments)

{
  pointer ppDVar1;
  DatFileItem *this_00;
  _Alloc_hider _Var2;
  size_type sVar3;
  int iVar4;
  vector<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_> *pvVar5;
  ostream *poVar6;
  uchar *puVar7;
  pointer ppDVar8;
  size_type sVar9;
  string name;
  string fullpath;
  string directory;
  string local_688;
  ofstream stream;
  DatFile datFile;
  
  std::__cxx11::string::string((string *)&local_688,(string *)&arguments->source);
  DatFile::DatFile(&datFile,&local_688,false);
  std::__cxx11::string::~string((string *)&local_688);
  DatFile::version(&datFile);
  pvVar5 = DatFile::items(&datFile);
  ppDVar1 = (pvVar5->
            super__Vector_base<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppDVar8 = (pvVar5->
                 super__Vector_base<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppDVar8 != ppDVar1;
      ppDVar8 = ppDVar8 + 1) {
    this_00 = *ppDVar8;
    DatFileItem::name_abi_cxx11_(&name,this_00);
    stream = (ofstream)0x5c;
    fullpath._M_dataplus._M_p._0_1_ = 0x2f;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )name._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(name._M_dataplus._M_p + name._M_string_length),(char *)&stream,(char *)&fullpath);
    sVar3 = name._M_string_length;
    _Var2 = name._M_dataplus;
    if (arguments->transformNames == true) {
      for (sVar9 = 0; sVar3 != sVar9; sVar9 = sVar9 + 1) {
        iVar4 = tolower((int)_Var2._M_p[sVar9]);
        _Var2._M_p[sVar9] = (char)iVar4;
      }
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream,
                   &arguments->destination,"/");
    std::operator+(&fullpath,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream,
                   &name);
    std::__cxx11::string::~string((string *)&stream);
    std::__cxx11::string::rfind((char)&fullpath,0x2f);
    std::__cxx11::string::substr((ulong)&directory,(ulong)&fullpath);
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)&stream,&directory,auto_format);
    std::filesystem::create_directories((path *)&stream);
    std::filesystem::__cxx11::path::~path((path *)&stream);
    if (arguments->quietMode == false) {
      poVar6 = std::operator<<((ostream *)&std::cout,(string *)&fullpath);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    std::ofstream::ofstream((path *)&stream);
    std::ofstream::open((char *)&stream,
                        (_Ios_Openmode)
                        CONCAT71(fullpath._M_dataplus._M_p._1_7_,fullpath._M_dataplus._M_p._0_1_));
    puVar7 = DatFileItem::data(this_00);
    DatFileItem::unpackedSize(this_00);
    std::ostream::write((char *)&stream,(long)puVar7);
    std::ofstream::close();
    puVar7 = DatFileItem::data(this_00);
    if (puVar7 != (uchar *)0x0) {
      operator_delete__(puVar7);
    }
    std::ofstream::~ofstream(&stream);
    std::__cxx11::string::~string((string *)&directory);
    std::__cxx11::string::~string((string *)&fullpath);
    std::__cxx11::string::~string((string *)&name);
  }
  DatFile::~DatFile(&datFile);
  return true;
}

Assistant:

bool DatFileUnpacker::unpack(const Arguments& arguments)
    {
        DatFile datFile(arguments.source);

        //if (arguments.format == Format::FALLOUT2) {
        //    datFile.setVersion(DatFile::VERSION::FALLOUT2);
        //} else {
        //    datFile.setVersion(DatFile::VERSION::FALLOUT1);
        //}

        // TODO: refactor DatFile to get rid of this call
        if (datFile.version()) {

        }

        if (!checkDatFile(datFile, arguments)) {
            return false;
        }

        // extract items
        for (auto item : *datFile.items()) {

            std::string name = item->name();
            std::replace(name.begin(), name.end(), '\\', '/');

            if (arguments.transformNames) {
                std::transform(name.begin(), name.end(), name.begin(), ::tolower);
            }

            std::string fullpath = arguments.destination + "/" + name;
            std::string directory = fullpath.substr(0, fullpath.find_last_of('/'));

            std::filesystem::create_directories(directory);

            if (!arguments.quietMode) {
                std::cout << fullpath << std::endl;
            }

            std::ofstream stream;
            stream.open(fullpath.c_str(), std::ofstream::out | std::ofstream::binary);
            stream.write((char*)item->data(), item->unpackedSize());
            stream.close();
            delete [] item->data();
        }

        return true;
    }